

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O3

void lts2::CreateWaveletDisplay(Mat *waves,Mat *display,int ww,int wh)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  _InputArray *p_Var5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  double wmax;
  double wmin;
  Mat C;
  Mat HV;
  Mat VV;
  Mat HH;
  Mat submat;
  double local_280;
  double local_278;
  ulong local_270;
  Mat *local_268;
  ulong local_260;
  ulong local_258;
  uint local_250;
  uint local_24c;
  _InputArray local_248;
  Range local_230;
  Range local_228;
  _InputArray local_220 [3];
  long *local_1d8;
  _InputArray local_1c0 [4];
  _InputArray local_160 [4];
  undefined8 local_100;
  _InputArray local_f8 [4];
  undefined1 local_98 [104];
  
  local_100 = CONCAT44((int)**(undefined8 **)(waves + 0x40),
                       (int)((ulong)**(undefined8 **)(waves + 0x40) >> 0x20));
  cv::Mat::create(display,&local_100,0);
  local_220[0].obj = local_98;
  local_98._16_16_ = (undefined1  [16])0x0;
  local_98._0_16_ = (undefined1  [16])0x0;
  local_220[0].flags = -0x3efdfffa;
  local_220[0].sz = (Size)&DAT_400000001;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)display,local_220);
  uVar12 = ww / 2;
  uVar6 = (ulong)uVar12;
  uVar9 = (ulong)(uint)(wh / 2);
  cv::Mat::Mat((Mat *)local_98);
  cv::Mat::Mat((Mat *)local_220);
  local_160[0]._0_8_ = uVar9 << 0x20;
  local_1c0[0]._0_8_ = uVar6 << 0x20;
  local_268 = waves;
  cv::Mat::Mat((Mat *)local_f8,waves,(Range *)local_160,(Range *)local_1c0);
  local_270 = CONCAT44(local_270._4_4_,wh);
  cv::Mat::operator=((Mat *)local_98,(Mat *)local_f8);
  cv::Mat::~Mat((Mat *)local_f8);
  local_f8[0].sz.width = 0;
  local_f8[0].sz.height = 0;
  local_f8[0].flags = 0x1010000;
  local_f8[0].obj = (Mat *)local_98;
  p_Var5 = (_InputArray *)cv::noArray();
  cv::minMaxLoc(local_f8,&local_278,&local_280,(Point_ *)0x0,(Point_ *)0x0,p_Var5);
  local_f8[0].sz.width = 0;
  local_f8[0].sz.height = 0;
  local_f8[0].flags = 0x2010000;
  local_f8[0].obj = local_220;
  cv::Mat::convertTo((_OutputArray *)local_98,(int)local_f8,255.0 / (local_280 - local_278),
                     (local_278 * -255.0) / (local_280 - local_278));
  if (1 < (int)local_270) {
    uVar8 = 0;
    do {
      if (1 < ww) {
        lVar7 = *local_1d8;
        lVar1 = **(long **)(display + 0x48);
        lVar2 = *(long *)(display + 0x10);
        lVar10 = 0;
        do {
          *(undefined1 *)(lVar1 * uVar8 + lVar2 + lVar10) =
               ((undefined1 *)(lVar7 * uVar8 + (long)local_220[0].sz))[lVar10];
          lVar10 = lVar10 + 1;
        } while (uVar12 != (uint)lVar10);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar9);
  }
  uVar14 = *(uint *)(local_268 + 0xc);
  uVar8 = uVar9;
  uVar13 = uVar6;
  if ((int)uVar12 <= (int)uVar14 / 2) {
    do {
      uVar12 = *(uint *)(local_268 + 8);
      if ((int)uVar12 / 2 < (int)uVar9) break;
      iVar3 = (int)uVar6;
      local_24c = (int)uVar13 + iVar3;
      if ((int)local_24c <= (int)uVar14) {
        uVar14 = local_24c;
      }
      local_250 = (int)uVar9 + (int)uVar8;
      if ((int)local_250 <= (int)uVar12) {
        uVar12 = local_250;
      }
      local_160[0]._0_8_ = (ulong)uVar12 << 0x20;
      local_230 = (Range)(uVar13 | (ulong)uVar14 << 0x20);
      local_270 = uVar9;
      local_260 = uVar13;
      local_258 = uVar8;
      local_1c0[0]._0_8_ = local_230;
      cv::Mat::Mat((Mat *)local_f8,local_268,(Range *)local_160,(Range *)local_1c0);
      local_160[0].sz.width = 0;
      local_160[0].sz.height = 0;
      local_160[0].flags = 0x1010000;
      local_160[0].obj = local_f8;
      p_Var5 = (_InputArray *)cv::noArray();
      cv::minMaxLoc(local_160,&local_278,&local_280,(Point_ *)0x0,(Point_ *)0x0,p_Var5);
      local_160[0].sz.width = 0;
      local_160[0].sz.height = 0;
      local_160[0].flags = 0x2010000;
      local_160[0].obj = local_220;
      cv::Mat::convertTo((_OutputArray *)local_f8,(int)local_160,255.0 / (local_280 - local_278),
                         (local_278 * -255.0) / (local_280 - local_278));
      local_260 = (ulong)(int)local_260;
      uVar9 = local_270 & 0xffffffff;
      if (0 < (int)local_270) {
        uVar6 = 0;
        do {
          if (0 < iVar3) {
            lVar7 = *local_1d8;
            lVar1 = *(long *)(display + 0x10);
            lVar2 = **(long **)(display + 0x48);
            lVar10 = 0;
            do {
              *(undefined1 *)(lVar2 * uVar6 + lVar1 + local_260 + lVar10) =
                   ((undefined1 *)(lVar7 * uVar6 + (long)local_220[0].sz))[lVar10];
              lVar10 = lVar10 + 1;
            } while (iVar3 != (int)lVar10);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar9);
      }
      iVar4 = (int)local_258;
      local_1c0[0].flags = (int)local_258;
      local_248._0_8_ = (ulong)uVar14 << 0x20;
      local_1c0[0]._4_4_ = uVar12;
      cv::Mat::Mat((Mat *)local_160,local_268,(Range *)local_1c0,(Range *)&local_248);
      local_1c0[0].sz.width = 0;
      local_1c0[0].sz.height = 0;
      local_1c0[0].flags = 0x1010000;
      local_1c0[0].obj = local_160;
      p_Var5 = (_InputArray *)cv::noArray();
      cv::minMaxLoc(local_1c0,&local_278,&local_280,(Point_ *)0x0,(Point_ *)0x0,p_Var5);
      local_1c0[0].sz.width = 0;
      local_1c0[0].sz.height = 0;
      local_1c0[0].flags = 0x2010000;
      local_1c0[0].obj = local_220;
      cv::Mat::convertTo((_OutputArray *)local_160,(int)local_1c0,255.0 / (local_280 - local_278),
                         (local_278 * -255.0) / (local_280 - local_278));
      if (0 < (int)local_270) {
        lVar7 = (long)(int)local_258;
        uVar6 = 0;
        do {
          if (0 < iVar3) {
            lVar1 = *local_1d8;
            lVar2 = **(long **)(display + 0x48);
            lVar10 = *(long *)(display + 0x10);
            lVar11 = 0;
            do {
              *(undefined1 *)(lVar2 * lVar7 + lVar10 + lVar11) =
                   ((undefined1 *)(lVar1 * uVar6 + (long)local_220[0].sz))[lVar11];
              lVar11 = lVar11 + 1;
            } while (iVar3 != (int)lVar11);
          }
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 1;
        } while (uVar6 != uVar9);
      }
      local_248.flags = iVar4;
      local_228 = local_230;
      local_248._4_4_ = uVar12;
      cv::Mat::Mat((Mat *)local_1c0,local_268,(Range *)&local_248,&local_228);
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x1010000;
      local_248.obj = local_1c0;
      p_Var5 = (_InputArray *)cv::noArray();
      cv::minMaxLoc(&local_248,&local_278,&local_280,(Point_ *)0x0,(Point_ *)0x0,p_Var5);
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x2010000;
      local_248.obj = local_220;
      cv::Mat::convertTo((_OutputArray *)local_1c0,(int)&local_248,255.0 / (local_280 - local_278),
                         (local_278 * -255.0) / (local_280 - local_278));
      if (0 < (int)local_270) {
        lVar7 = (long)(int)local_258;
        uVar6 = 0;
        do {
          if (0 < iVar3) {
            lVar1 = *local_1d8;
            lVar2 = *(long *)(display + 0x10);
            lVar10 = **(long **)(display + 0x48);
            lVar11 = 0;
            do {
              *(undefined1 *)(lVar10 * lVar7 + lVar2 + local_260 + lVar11) =
                   ((undefined1 *)(lVar1 * uVar6 + (long)local_220[0].sz))[lVar11];
              lVar11 = lVar11 + 1;
            } while (iVar3 != (int)lVar11);
          }
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 1;
        } while (uVar6 != uVar9);
      }
      uVar6 = (ulong)(uint)(iVar3 * 2);
      uVar9 = (ulong)(uint)((int)local_270 * 2);
      cv::Mat::~Mat((Mat *)local_1c0);
      cv::Mat::~Mat((Mat *)local_160);
      cv::Mat::~Mat((Mat *)local_f8);
      uVar14 = *(uint *)(local_268 + 0xc);
      uVar8 = (ulong)local_250;
      uVar13 = (ulong)local_24c;
    } while (iVar3 * 2 <= (int)uVar14 / 2);
  }
  cv::Mat::~Mat((Mat *)local_220);
  cv::Mat::~Mat((Mat *)local_98);
  return;
}

Assistant:

void lts2::CreateWaveletDisplay(const cv::Mat &waves, cv::Mat &display, int ww, int wh)
{
  display.create(waves.size(), CV_8U);
  display.setTo(cv::Scalar(0));
    
  // Find the continuous part first
  int subWindowWidth = ww / 2;
  int subWindowHeight = wh / 2;

  cv::Mat submat;
    
  cv::Mat C;
  submat = waves(cv::Range(0, subWindowHeight), cv::Range(0, subWindowWidth));
    
  double wmin, wmax, wrange;
  cv::minMaxLoc(submat, &wmin, &wmax);
  wrange = wmax - wmin;
    
  submat.convertTo(C, CV_8UC1, 255.0/wrange, -255.0f*wmin/wrange);
    
  for (int y = 0; y < subWindowHeight; ++y)
  {
    const uchar* srcptr = C.ptr<uchar>(y);
    uchar* destptr = display.ptr<uchar>(y);
        
    for (int x = 0; x < subWindowWidth; ++x)
      *destptr++ = *srcptr++;
  }
    
  // Now for the diff images
  int offsetX = subWindowWidth;
  int offsetY = subWindowHeight;
    
  while (subWindowWidth <= waves.cols/2 && subWindowHeight <= waves.rows/2) 
  {
    int maxX = MIN(waves.cols, offsetX + subWindowWidth);
    int maxY = MIN(waves.rows, offsetY + subWindowHeight);
        
    // HH
    cv::Mat HH = waves(cv::Range(0, maxY), cv::Range(offsetX, maxX));
    cv::minMaxLoc(HH, &wmin, &wmax);
    wrange = wmax - wmin;
    HH.convertTo(C, CV_8UC1, 255.0/wrange, -255.0*wmin/(wmax-wmin));
        
    for (int y = 0; y < subWindowHeight; ++y)
    {
      const uchar* srcptr = C.ptr<uchar>(y);
      uchar* destptr = display.ptr<uchar>(y) + offsetX;
            
      for (int x = 0; x < subWindowWidth; ++x)
        *destptr++ = *srcptr++;
    }

    // VV
    cv::Mat VV = waves(cv::Range(offsetY, maxY), cv::Range(0, maxX));
    cv::minMaxLoc(VV, &wmin, &wmax);
    wrange = wmax - wmin;
    VV.convertTo(C, CV_8UC1, 255.0/wrange, -255.0*wmin/(wmax-wmin));
        
    for (int y = 0; y < subWindowHeight; ++y)
    {
      const uchar* srcptr = C.ptr<uchar>(y);
      uchar* destptr = display.ptr<uchar>(y+offsetY);
            
      for (int x = 0; x < subWindowWidth; ++x)
        *destptr++ = *srcptr++;
    }
        
    // HV
    cv::Mat HV = waves(cv::Range(offsetY, maxY), cv::Range(offsetX, maxX));
    cv::minMaxLoc(HV, &wmin, &wmax);
    wrange = wmax - wmin;
    HV.convertTo(C, CV_8UC1, 255.0/wrange, -255.0*wmin/(wmax-wmin));
        
    for (int y = 0; y < subWindowHeight; ++y)
    {
      const uchar* srcptr = C.ptr<uchar>(y);
      uchar* destptr = display.ptr<uchar>(y+offsetY) + offsetX;
            
      for (int x = 0; x < subWindowWidth; ++x)
        *destptr++ = *srcptr++;
    }
        
    // Update the bounds
    offsetX += subWindowWidth;
    offsetY += subWindowHeight;
    subWindowWidth *= 2;
    subWindowHeight *= 2;
  }
}